

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# svgelement.cpp
# Opt level: O2

Rect __thiscall lunasvg::SVGMaskElement::maskRect(SVGMaskElement *this,SVGElement *element)

{
  float fVar1;
  float fVar2;
  float fVar3;
  float fVar4;
  float extraout_XMM0_Da;
  float extraout_XMM0_Db;
  undefined8 in_XMM1_Qa;
  float fVar5;
  Rect RVar6;
  LengthContext lengthContext;
  LengthContext local_28;
  
  local_28.m_units = (this->m_maskUnits).super_SVGProperty.field_0x9;
  local_28.m_element = &this->super_SVGElement;
  fVar1 = LengthContext::valueForLength(&local_28,&this->m_x);
  fVar2 = LengthContext::valueForLength(&local_28,&this->m_y);
  fVar3 = LengthContext::valueForLength(&local_28,&this->m_width);
  fVar4 = LengthContext::valueForLength(&local_28,&this->m_height);
  if ((this->m_maskUnits).super_SVGProperty.field_0x9 == '\x01') {
    (*(element->super_SVGNode)._vptr_SVGNode[0xb])(element);
    fVar5 = (float)((ulong)in_XMM1_Qa >> 0x20);
    fVar1 = fVar1 * (float)in_XMM1_Qa + extraout_XMM0_Da;
    fVar2 = fVar2 * fVar5 + extraout_XMM0_Db;
    fVar3 = fVar3 * (float)in_XMM1_Qa;
    fVar4 = fVar4 * fVar5;
  }
  RVar6.h = fVar4;
  RVar6.w = fVar3;
  RVar6.y = fVar2;
  RVar6.x = fVar1;
  return RVar6;
}

Assistant:

Rect SVGMaskElement::maskRect(const SVGElement* element) const
{
    LengthContext lengthContext(this, m_maskUnits.value());
    Rect maskRect = {
        lengthContext.valueForLength(m_x),
        lengthContext.valueForLength(m_y),
        lengthContext.valueForLength(m_width),
        lengthContext.valueForLength(m_height)
    };

    if(m_maskUnits.value() == Units::ObjectBoundingBox) {
        auto bbox = element->fillBoundingBox();
        maskRect.x = maskRect.x * bbox.w + bbox.x;
        maskRect.y = maskRect.y * bbox.h + bbox.y;
        maskRect.w = maskRect.w * bbox.w;
        maskRect.h = maskRect.h * bbox.h;
    }

    return maskRect;
}